

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

void gog::anon_unknown_0::process_rar_files
               (vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *files,
               extract_options *o,info *info)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  type tVar4;
  char *pcVar5;
  size_type sVar6;
  ostream *poVar7;
  path *lhs;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  const_reference this_00;
  EVP_PKEY_CTX *in_RDX;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *in_RDI;
  path symlink;
  path *file_1;
  bool _foreach_continue367;
  auto_any_t _foreach_end367;
  auto_any_t _foreach_cur367;
  auto_any_t _foreach_col367;
  ostringstream oss;
  size_t i_1;
  string basename;
  path here;
  path first_file;
  temporary_directory tmpdir;
  signal_handler old_sighup_handler;
  signal_handler old_sigterm_handler;
  signal_handler old_sigint_handler;
  path *file;
  bool _foreach_continue325;
  auto_any_t _foreach_end325;
  auto_any_t _foreach_cur325;
  auto_any_t _foreach_col325;
  bool ok;
  size_t i;
  char hash [16];
  md5 md5;
  string password;
  false_ *in_stack_fffffffffffff918;
  string *in_stack_fffffffffffff920;
  extract_options *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  undefined7 in_stack_fffffffffffff940;
  byte in_stack_fffffffffffff947;
  char *in_stack_fffffffffffff948;
  iterated_hash<crypto::md5_transform> *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  _Setw in_stack_fffffffffffff95c;
  byte local_669;
  byte local_621;
  info *in_stack_fffffffffffffa28;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598 [2];
  temporary_directory *in_stack_fffffffffffffac0;
  string local_538 [192];
  path *in_stack_fffffffffffffb88;
  temporary_directory *in_stack_fffffffffffffb90;
  string local_430 [64];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  string local_3c8 [32];
  type local_3a8;
  bool local_399;
  __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
  local_398;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_390;
  __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
  local_388;
  undefined1 local_380 [16];
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_370;
  ostream local_368;
  ulong local_1f0;
  string local_1c8 [64];
  undefined1 local_188 [32];
  temporary_directory local_168;
  __sighandler_t local_128;
  __sighandler_t local_120;
  __sighandler_t local_118;
  int local_10c;
  type local_108;
  bool local_f9;
  __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
  local_f8;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_f0;
  __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
  local_e8;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_d0;
  byte local_c1;
  ulong local_c0;
  byte local_b8 [40];
  iterated_hash<crypto::md5_transform> local_90;
  string local_38 [32];
  EVP_PKEY_CTX *local_18;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *local_8;
  
  if (((((in_RSI->field_0x6 & 1) != 0) || ((in_RSI->field_0x7 & 1) != 0)) ||
      (((byte)(in_RSI->second)._M_dataplus & 1) != 0)) &&
     (local_18 = in_RDX, local_10 = in_RSI, local_8 = in_RDI,
     bVar1 = std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::empty
                       ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
                        CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930)), !bVar1)) {
    get_game_id_abi_cxx11_(in_stack_fffffffffffffa28);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      crypto::iterated_hash<crypto::md5_transform>::init(&local_90,local_18);
      std::__cxx11::string::c_str();
      std::__cxx11::string::length();
      crypto::iterated_hash<crypto::md5_transform>::update
                (in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                 CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
      crypto::iterated_hash<crypto::md5_transform>::finalize
                ((iterated_hash<crypto::md5_transform> *)
                 CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 &in_stack_fffffffffffff928->quiet);
      boost::size<char[16]>((char (*) [16])0x140742);
      std::__cxx11::string::resize((ulong)local_38);
      for (local_c0 = 0; uVar3 = local_c0, tVar4 = boost::size<char[16]>((char (*) [16])0x14078f),
          uVar3 < tVar4; local_c0 = local_c0 + 1) {
        cVar2 = hex_char((uint)(local_b8[local_c0] >> 4));
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        *pcVar5 = cVar2;
        cVar2 = hex_char(local_b8[local_c0] & 0xf);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        *pcVar5 = cVar2;
      }
    }
    if ((((((byte)(local_10->second)._M_dataplus & 1) == 0) && ((local_10->field_0x7 & 1) == 0)) &&
        ((local_10->field_0x6 & 1) != 0)) ||
       (sVar6 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::size
                          (local_8), sVar6 == 1)) {
      local_c1 = 1;
      local_d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 boost::foreach_detail_::contain<std::__cxx11::string_const>
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffff928,(false_ *)in_stack_fffffffffffff920);
      local_d0 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)&local_d8;
      bVar1 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_d0);
      if (!bVar1) {
        local_e8._M_current =
             (path *)boost::foreach_detail_::
                     begin<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                               ((auto_any_t)in_stack_fffffffffffff928,
                                (type2type<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_mpl_::bool_<true>_>
                                 *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
        local_e0 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                    *)&local_e8;
        bVar1 = boost::iostreams::detail::
                indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                ::can_write(local_e0);
        if (!bVar1) {
          local_f8._M_current =
               (path *)boost::foreach_detail_::
                       end<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                                 ((auto_any_t)in_stack_fffffffffffff928,
                                  (type2type<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_mpl_::bool_<true>_>
                                   *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
          local_f0 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                      *)&local_f8;
          bVar1 = boost::iostreams::detail::
                  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  ::can_write(local_f0);
          if (!bVar1) {
            local_f9 = true;
            while( true ) {
              local_621 = 0;
              if ((local_f9 & 1U) != 0) {
                bVar1 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                                  ((auto_any_t)
                                   CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                                   (auto_any_t)in_stack_fffffffffffff928,
                                   (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                    *)in_stack_fffffffffffff920);
                local_621 = bVar1 ^ 0xff;
              }
              if ((local_621 & 1) == 0) break;
              bVar1 = boost::foreach_detail_::set_false(&local_f9);
              if (!bVar1) {
                ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x0;
                local_108 = boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                                      ((auto_any_t)in_stack_fffffffffffff920,
                                       (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                        *)in_stack_fffffffffffff918);
                while (((local_f9 ^ 0xffU) & 1) != 0) {
                  std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_108,ppVar8);
                  ppVar8 = local_10;
                  bVar1 = process_rar_file((string *)
                                           CONCAT17(in_stack_fffffffffffff937,
                                                    in_stack_fffffffffffff930),
                                           in_stack_fffffffffffff928,in_stack_fffffffffffff920);
                  if (!bVar1) {
                    local_c1 = 0;
                  }
                  local_f9 = true;
                }
              }
              if ((local_f9 & 1U) != 0) {
                boost::foreach_detail_::
                next<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                          ((auto_any_t)in_stack_fffffffffffff920,
                           (type2type<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<true>_>
                            *)in_stack_fffffffffffff918);
              }
            }
          }
        }
      }
      if ((local_c1 & 1) == 0) {
LAB_0014155c:
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        (anonymous_namespace)::get_verb_abi_cxx11_
                  ((extract_options *)
                   CONCAT44(in_stack_fffffffffffff95c._M_n,in_stack_fffffffffffff958));
        std::operator+(&in_stack_fffffffffffff928->quiet,__rhs);
        ppVar8 = local_598;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff928,(char *)__rhs);
        this_00 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                  front((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *
                        )__rhs);
        std::__niter_base<std::pair<bool,std::__cxx11::string>*>(this_00,ppVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff928,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff928,(char *)__rhs);
        std::runtime_error::runtime_error((runtime_error *)__rhs,local_538);
        __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_10c = 1;
    }
    else {
      local_118 = signal(2,quit_handler);
      local_120 = signal(0xf,quit_handler);
      local_128 = signal(1,quit_handler);
      temporary_directory::temporary_directory(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      std::_Construct<std::__cxx11::string>((path *)0x140ba5);
      boost::filesystem::current_path();
      std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::front
                ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                 in_stack_fffffffffffff920);
      boost::filesystem::path::stem();
      boost::filesystem::path::string<std::__cxx11::string>((path *)in_stack_fffffffffffff928);
      std::_Destroy<std::__cxx11::string>((path *)0x140bf7);
      bVar1 = boost::algorithm::ends_with<std::__cxx11::string,char[3]>
                        (in_stack_fffffffffffff920,(char (*) [3])in_stack_fffffffffffff918);
      if (bVar1) {
        std::__cxx11::string::length();
        std::__cxx11::string::resize((ulong)local_1c8);
      }
      local_1f0 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
      ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
      local_380._8_8_ =
           boost::foreach_detail_::contain<std::__cxx11::string_const>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffff928,(false_ *)in_stack_fffffffffffff920);
      local_370 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                   *)(local_380 + 8);
      bVar1 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_370);
      if (!bVar1) {
        ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
        local_388._M_current =
             (path *)boost::foreach_detail_::
                     begin<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                               ((auto_any_t)in_stack_fffffffffffff928,
                                (type2type<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_mpl_::bool_<true>_>
                                 *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
        local_380._0_8_ = &local_388;
        bVar1 = boost::iostreams::detail::
                indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                ::can_write((indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                             *)local_380._0_8_);
        if (!bVar1) {
          ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0;
          local_398._M_current =
               (path *)boost::foreach_detail_::
                       end<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                                 ((auto_any_t)in_stack_fffffffffffff928,
                                  (type2type<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_mpl_::bool_<true>_>
                                   *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
          local_390 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_398;
          bVar1 = boost::iostreams::detail::
                  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  ::can_write((indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                               *)local_390);
          if (!bVar1) {
            local_399 = true;
            while( true ) {
              local_669 = 0;
              if ((local_399 & 1U) != 0) {
                ppVar8 = local_390;
                bVar1 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                                  ((auto_any_t)
                                   CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                                   (auto_any_t)in_stack_fffffffffffff928,
                                   (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                    *)in_stack_fffffffffffff920);
                local_669 = bVar1 ^ 0xff;
              }
              if ((local_669 & 1) == 0) break;
              bVar1 = boost::foreach_detail_::set_false(&local_399);
              if (!bVar1) {
                ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x0;
                local_3a8 = boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                                      ((auto_any_t)in_stack_fffffffffffff920,
                                       (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                        *)in_stack_fffffffffffff918);
                while (((local_399 ^ 0xffU) & 1) != 0) {
                  std::__cxx11::string::string(local_3c8);
                  std::__cxx11::ostringstream::str((string *)&local_368);
                  std::__cxx11::string::~string(local_3c8);
                  poVar7 = std::operator<<(&local_368,local_1c8);
                  poVar7 = std::operator<<(poVar7,".r");
                  local_3f0.second.field_2._M_local_buf[0xf] = (char)std::setfill<char>('0');
                  poVar7 = std::operator<<(poVar7,local_3f0.second.field_2._M_local_buf[0xf]);
                  in_stack_fffffffffffff95c = std::setprecision(2);
                  local_3f0.second.field_2._8_4_ = in_stack_fffffffffffff95c;
                  poVar7 = std::operator<<(poVar7,in_stack_fffffffffffff95c);
                  std::ostream::operator<<(poVar7,local_1f0);
                  lhs = temporary_directory::get(&local_168);
                  std::__cxx11::ostringstream::str();
                  std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
                            ((path *)in_stack_fffffffffffff920,(path *)in_stack_fffffffffffff918);
                  boost::filesystem::operator/
                            (lhs,(path *)CONCAT17(in_stack_fffffffffffff947,
                                                  in_stack_fffffffffffff940));
                  std::_Destroy<std::__cxx11::string>((path *)0x140fdf);
                  std::__cxx11::string::~string(local_430);
                  boost::filesystem::path::root_path();
                  in_stack_fffffffffffff947 = boost::filesystem::path::empty((path *)0x141010);
                  std::_Destroy<std::__cxx11::string>((path *)0x141021);
                  if ((in_stack_fffffffffffff947 & 1) == 0) {
                    ppVar8 = &local_3f0;
                    boost::filesystem::create_symlink
                              ((path *)in_stack_fffffffffffff920,(path *)in_stack_fffffffffffff918);
                  }
                  else {
                    boost::filesystem::operator/
                              (lhs,(path *)CONCAT17(in_stack_fffffffffffff947,
                                                    in_stack_fffffffffffff940));
                    ppVar8 = &local_3f0;
                    boost::filesystem::create_symlink
                              ((path *)in_stack_fffffffffffff920,(path *)in_stack_fffffffffffff918);
                    std::_Destroy<std::__cxx11::string>((path *)0x141071);
                  }
                  if (local_1f0 == 0) {
                    ppVar8 = &local_3f0;
                    boost::filesystem::path::operator=
                              ((path *)in_stack_fffffffffffff920,(path *)in_stack_fffffffffffff918);
                  }
                  local_1f0 = local_1f0 + 1;
                  std::_Destroy<std::__cxx11::string>((path *)0x14117f);
                  local_399 = true;
                }
              }
              if ((local_399 & 1U) != 0) {
                ppVar8 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x0;
                boost::foreach_detail_::
                next<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>,mpl_::bool_<true>>
                          ((auto_any_t)in_stack_fffffffffffff920,
                           (type2type<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<true>_>
                            *)in_stack_fffffffffffff918);
              }
            }
          }
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_368);
      std::__cxx11::string::~string(local_1c8);
      std::_Destroy<std::__cxx11::string>((path *)0x1411f2);
      std::__niter_base<std::pair<bool,std::__cxx11::string>*>(local_188,ppVar8);
      bVar1 = process_rar_file((string *)
                               CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                               in_stack_fffffffffffff928,in_stack_fffffffffffff920);
      if (bVar1) {
        local_10c = 1;
      }
      else {
        signal(1,local_128);
        signal(0xf,local_120);
        signal(2,local_118);
        if ((anonymous_namespace)::quit_requested != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Aborted!");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_10c = 0;
      }
      std::_Destroy<std::__cxx11::string>((path *)0x14151d);
      temporary_directory::~temporary_directory(in_stack_fffffffffffffac0);
      if (local_10c == 0) goto LAB_0014155c;
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void process_rar_files(const std::vector<fs::path> & files,
                       const extract_options & o, const setup::info & info) {
	
	if((!o.list && !o.test && !o.extract) || files.empty()) {
		return;
	}
	
	// Calculate password from the GOG.com game ID
	std::string password = get_game_id(info);
	if(!password.empty()) {
		crypto::md5 md5;
		md5.init();
		md5.update(password.c_str(), password.length());
		char hash[16];
		md5.finalize(hash);
		password.resize(size_t(boost::size(hash) * 2));
		for(size_t i = 0; i < size_t(boost::size(hash)); i++) {
			password[2 * i + 0] = hex_char(boost::uint8_t(hash[i]) / 16);
			password[2 * i + 1] = hex_char(boost::uint8_t(hash[i]) % 16);
		}
	}
	
	if((!o.extract && !o.test && o.list) || files.size() == 1) {
		
		// When listing contents or for single-file archives, pass the bin file to unrar
		
		bool ok = true;
		BOOST_FOREACH(const fs::path & file, files) {
			if(!process_rar_file(file.string(), o, password)) {
				ok = false;
			}
		}
		
		if(ok) {
			return;
		}
		
	} else {
		
		/*
		 * When extracting multi-part archives we need to create symlinks with special
		 * names so that unrar will find all the parts of the archive.
		 */
		
		typedef void(*signal_handler /* … */)(int /* … */);
		#ifdef SIGINT
		signal_handler old_sigint_handler = signal(SIGINT, quit_handler);
		#endif
		#ifdef SIGTERM
		signal_handler old_sigterm_handler = signal(SIGTERM, quit_handler);
		#endif
		#ifdef SIGHUP
		signal_handler old_sighup_handler = signal(SIGHUP, quit_handler);
		#endif
		
		temporary_directory tmpdir(o.output_dir);
		
		fs::path first_file;
		try {
			
			fs::path here = fs::current_path();
			
			std::string basename = util::as_string(files.front().stem());
			if(boost::ends_with(basename, "-1")) {
				basename.resize(basename.length() - 2);
			}
			
			size_t i = 0;
			std::ostringstream oss;
			BOOST_FOREACH(const fs::path & file, files) {
				
				oss.str(std::string());
				oss << basename << ".r" << std::setfill('0') << std::setw(2) << i;
				fs::path symlink = tmpdir.get() / oss.str();
				
				if(file.root_path().empty()) {
					fs::create_symlink(here / file, symlink);
				} else {
					fs::create_symlink(file, symlink);
				}
				
				if(i == 0) {
					first_file = symlink;
				}
				
				i++;
			}
			
		} catch(...) {
			throw std::runtime_error("Could not " + get_verb(o)
			                         + " \"" + files.front().string()
			                         + "\": unable to create .r?? symlinks");
		}
		
		if(process_rar_file(first_file.string(), o, password)) {
			return;
		}
		
		#ifdef SIGHUP
		signal(SIGHUP, old_sighup_handler);
		#endif
		#ifdef SIGTERM
		signal(SIGTERM, old_sigterm_handler);
		#endif
		#ifdef SIGINT
		signal(SIGINT, old_sigint_handler);
		#endif
		if(quit_requested) {
			throw std::runtime_error("Aborted!");
		}
		
	}
	
	throw std::runtime_error("Could not " + get_verb(o) + " \"" + files.front().string()
	                         + "\": install `unrar` or `unar`");
}